

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O0

int __thiscall Fl_Button::handle(Fl_Button *this,int event)

{
  int X_00;
  uchar uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Fl_Boxtype FVar5;
  int iVar6;
  int iVar7;
  Fl_When FVar8;
  Fl_Window *pFVar9;
  Fl_Button *pFVar10;
  int local_68;
  int local_64;
  int local_60;
  Fl_Widget_Tracker local_48;
  Fl_Widget_Tracker wp_1;
  int Y;
  int X;
  Fl_Widget_Tracker local_28;
  Fl_Widget_Tracker wp;
  int newval;
  int event_local;
  Fl_Button *this_local;
  
  wp.wp_._4_4_ = event;
  switch(event) {
  case 1:
    iVar3 = Fl::visible_focus();
    if ((iVar3 != 0) && (iVar3 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar3 != 0))
    {
      Fl::focus(&this->super_Fl_Widget);
    }
  case 5:
    iVar3 = Fl::event_inside(&this->super_Fl_Widget);
    if (iVar3 == 0) {
      Fl_Widget::clear_changed(&this->super_Fl_Widget);
      wp.wp_._0_4_ = (uint)this->oldval;
    }
    else {
      uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
      if (uVar1 == 'f') {
        wp.wp_._0_4_ = 1;
      }
      else {
        wp.wp_._0_4_ = (uint)((this->oldval != '\0' ^ 0xffU) & 1);
      }
    }
    if ((uint)wp.wp_ != (int)this->value_) {
      this->value_ = (char)(uint)wp.wp_;
      Fl_Widget::set_changed(&this->super_Fl_Widget);
      Fl_Widget::redraw(&this->super_Fl_Widget);
      FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
      if ((FVar8 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback(&this->super_Fl_Widget);
      }
    }
    this_local._4_4_ = 1;
    break;
  case 2:
    if (this->value_ == this->oldval) {
      FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
      if ((FVar8 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback(&this->super_Fl_Widget);
      }
      this_local._4_4_ = 1;
    }
    else {
      Fl_Widget::set_changed(&this->super_Fl_Widget);
      uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
      if (uVar1 == 'f') {
        setonly(this);
      }
      else {
        uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
        if (uVar1 == '\x01') {
          this->oldval = this->value_;
        }
        else {
          value(this,(int)this->oldval);
          Fl_Widget::set_changed(&this->super_Fl_Widget);
          FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
          if ((FVar8 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
            Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,&this->super_Fl_Widget);
            Fl_Widget::do_callback(&this->super_Fl_Widget);
            iVar3 = Fl_Widget_Tracker::deleted(&local_28);
            if (iVar3 != 0) {
              this_local._4_4_ = 1;
            }
            Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
            if (iVar3 != 0) {
              return this_local._4_4_;
            }
          }
        }
      }
      FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
      if ((FVar8 & FL_WHEN_RELEASE) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback(&this->super_Fl_Widget);
      }
      this_local._4_4_ = 1;
    }
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar3 = Fl::visible_focus();
    if (iVar3 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
      if (FVar5 == FL_NO_BOX) {
        iVar3 = Fl_Widget::x(&this->super_Fl_Widget);
        if (iVar3 < 1) {
          local_64 = 0;
        }
        else {
          local_64 = Fl_Widget::x(&this->super_Fl_Widget);
          local_64 = local_64 + -1;
        }
        wp_1.wp_._4_4_ = local_64;
        iVar3 = Fl_Widget::y(&this->super_Fl_Widget);
        if (iVar3 < 1) {
          local_68 = 0;
        }
        else {
          local_68 = Fl_Widget::y(&this->super_Fl_Widget);
          local_68 = local_68 + -1;
        }
        wp_1.wp_._0_4_ = local_68;
        pFVar9 = Fl_Widget::window(&this->super_Fl_Widget);
        if (pFVar9 != (Fl_Window *)0x0) {
          pFVar9 = Fl_Widget::window(&this->super_Fl_Widget);
          X_00 = wp_1.wp_._4_4_;
          iVar3 = (int)wp_1.wp_;
          iVar6 = Fl_Widget::w(&this->super_Fl_Widget);
          iVar7 = Fl_Widget::h(&this->super_Fl_Widget);
          Fl_Widget::damage((Fl_Widget *)pFVar9,0x80,X_00,iVar3,iVar6 + 2,iVar7 + 2);
        }
      }
      else {
        Fl_Widget::redraw(&this->super_Fl_Widget);
      }
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    pFVar10 = (Fl_Button *)Fl::focus();
    if (((pFVar10 == this) && (iVar3 = Fl::event_key(), iVar3 == 0x20)) &&
       (uVar4 = Fl::event_state(), (uVar4 & 0x4d0000) == 0)) {
      Fl_Widget::set_changed(&this->super_Fl_Widget);
      goto LAB_001bc585;
    }
  default:
    this_local._4_4_ = 0;
    break;
  case 0xc:
    iVar3 = shortcut(this);
    if (iVar3 == 0) {
      local_60 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      uVar4 = shortcut(this);
      local_60 = Fl::test_shortcut(uVar4);
    }
    if (local_60 == 0) {
      return 0;
    }
    iVar3 = Fl::visible_focus();
    if ((iVar3 != 0) && (iVar3 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar3 != 0))
    {
      Fl::focus(&this->super_Fl_Widget);
    }
LAB_001bc585:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,&this->super_Fl_Widget);
    uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
    if (uVar1 == 'f') {
      if (this->value_ == '\0') {
        setonly(this);
        FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
        if ((FVar8 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
          Fl_Widget::do_callback(&this->super_Fl_Widget);
        }
      }
    }
    else {
      uVar1 = Fl_Widget::type(&this->super_Fl_Widget);
      if (uVar1 == '\x01') {
        cVar2 = value(this);
        value(this,(uint)(cVar2 == '\0'));
        FVar8 = Fl_Widget::when(&this->super_Fl_Widget);
        if ((FVar8 & FL_WHEN_CHANGED) != FL_WHEN_NEVER) {
          Fl_Widget::do_callback(&this->super_Fl_Widget);
        }
      }
      else {
        simulate_key_action(this);
      }
    }
    iVar3 = Fl_Widget_Tracker::deleted(&local_48);
    if ((iVar3 == 0) &&
       (FVar8 = Fl_Widget::when(&this->super_Fl_Widget), (FVar8 & FL_WHEN_RELEASE) != FL_WHEN_NEVER)
       ) {
      Fl_Widget::do_callback(&this->super_Fl_Widget);
    }
    this_local._4_4_ = 1;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Button::handle(int event) {
  int newval;
  switch (event) {
  case FL_ENTER: /* FALLTHROUGH */
  case FL_LEAVE:
//  if ((value_?selection_color():color())==FL_GRAY) redraw();
    return 1;
  case FL_PUSH:
    if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
    /* FALLTHROUGH */
  case FL_DRAG:
    if (Fl::event_inside(this)) {
      if (type() == FL_RADIO_BUTTON) newval = 1;
      else newval = !oldval;
    } else {
      clear_changed();
      newval = oldval;
    }
    if (newval != value_) {
      value_ = newval;
      set_changed();
      redraw();
      if (when() & FL_WHEN_CHANGED) do_callback();
    }
    return 1;
  case FL_RELEASE:
    if (value_ == oldval) {
      if (when() & FL_WHEN_NOT_CHANGED) do_callback();
      return 1;
    }
    set_changed();
    if (type() == FL_RADIO_BUTTON) setonly();
    else if (type() == FL_TOGGLE_BUTTON) oldval = value_;
    else {
      value(oldval);
      set_changed();
      if (when() & FL_WHEN_CHANGED) {
	Fl_Widget_Tracker wp(this);
        do_callback();
        if (wp.deleted()) return 1;
      }
    }
    if (when() & FL_WHEN_RELEASE) do_callback();
    return 1;
  case FL_SHORTCUT:
    if (!(shortcut() ?
	  Fl::test_shortcut(shortcut()) : test_shortcut())) return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
    goto triggered_by_keyboard;
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      if (box() == FL_NO_BOX) {
	// Widgets with the FL_NO_BOX boxtype need a parent to
	// redraw, since it is responsible for redrawing the
	// background...
	int X = x() > 0 ? x() - 1 : 0;
	int Y = y() > 0 ? y() - 1 : 0;
	if (window()) window()->damage(FL_DAMAGE_ALL, X, Y, w() + 2, h() + 2);
      } else redraw();
      return 1;
    } else return 0;
    /* NOTREACHED */
  case FL_KEYBOARD :
    if (Fl::focus() == this && Fl::event_key() == ' ' &&
        !(Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) {
      set_changed();
    triggered_by_keyboard:
      Fl_Widget_Tracker wp(this);
      if (type() == FL_RADIO_BUTTON) {
        if (!value_) {
	  setonly();
	  if (when() & FL_WHEN_CHANGED) do_callback();
        }
      } else if (type() == FL_TOGGLE_BUTTON) {
	value(!value());
	if (when() & FL_WHEN_CHANGED) do_callback();
      } else {
        simulate_key_action();
      }
      if (wp.deleted()) return 1;
      if (when() & FL_WHEN_RELEASE) do_callback();
      return 1;
    }
  default:
    return 0;
  }
}